

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O3

int Gia_ManSimulateWords(Gia_Man_t *p,int nWords)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  ulong uVar6;
  word wVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  
  pVVar4 = p->vSims;
  if (pVVar4 != (Vec_Wrd_t *)0x0) {
    if (pVVar4->pArray != (word *)0x0) {
      free(pVVar4->pArray);
      p->vSims->pArray = (word *)0x0;
      pVVar4 = p->vSims;
      if (pVVar4 == (Vec_Wrd_t *)0x0) goto LAB_0074912d;
    }
    free(pVVar4);
  }
LAB_0074912d:
  iVar13 = p->nObjs;
  iVar11 = iVar13 * nWords;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar3 = iVar11;
  }
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar3 << 3);
  }
  pVVar4->pArray = pwVar5;
  pVVar4->nSize = iVar11;
  memset(pwVar5,0,(long)iVar11 << 3);
  p->vSims = pVVar4;
  p->nSimWords = nWords;
  if (1 < iVar13) {
    lVar14 = 1;
    do {
      uVar8 = (uint)*(ulong *)(p->pObjs + lVar14);
      uVar6 = *(ulong *)(p->pObjs + lVar14) & 0x1fffffff;
      iVar13 = (int)lVar14;
      if (uVar6 == 0x1fffffff || (int)uVar8 < 0) {
        if ((~uVar8 & 0x9fffffff) == 0) {
          iVar3 = p->nSimWords;
          if ((iVar13 * iVar3 < 0) || (p->vSims->nSize <= iVar13 * iVar3)) goto LAB_0074932a;
          if (0 < iVar3) {
            pwVar5 = p->vSims->pArray;
            lVar12 = 0;
            do {
              wVar7 = Gia_ManRandomW(0);
              pwVar5[(ulong)(uint)(iVar3 * iVar13) + lVar12] = wVar7;
              lVar12 = lVar12 + 1;
            } while (lVar12 < p->nSimWords);
          }
        }
        else {
          if ((-1 < (int)uVar8) || ((int)uVar6 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                          ,0x6c,"int Gia_ManSimulateWords(Gia_Man_t *, int)");
          }
          uVar1 = p->nSimWords;
          if ((int)(uVar1 * iVar13) < 0) {
LAB_0074932a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          uVar2 = p->vSims->nSize;
          if ((int)uVar2 <= (int)(uVar1 * iVar13)) goto LAB_0074932a;
          uVar9 = uVar8 & 0x1fffffff;
          uVar10 = (iVar13 - uVar9) * uVar1;
          if (((int)uVar10 < 0) || (uVar2 <= uVar10)) goto LAB_0074932a;
          pwVar5 = p->vSims->pArray;
          if ((uVar8 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar6 = 0;
              do {
                pwVar5[uVar1 * iVar13 + uVar6] = pwVar5[(iVar13 - uVar9) * uVar1 + uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar1 != uVar6);
            }
          }
          else if (0 < (int)uVar1) {
            uVar6 = 0;
            do {
              pwVar5[uVar1 * iVar13 + uVar6] = ~pwVar5[(iVar13 - uVar9) * uVar1 + uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar1 != uVar6);
          }
        }
      }
      else {
        Gia_ManObjSimAnd(p,iVar13);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nObjs);
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWords( Gia_Man_t * p, int nWords )
{
    Gia_Obj_t * pObj; int i;
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            Gia_ManObjSimPi( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}